

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O3

void __thiscall QLabel::setBuddy(QLabel *this,QWidget *buddy)

{
  QLabelPrivate *this_00;
  Data *pDVar1;
  void **ppvVar2;
  ushort uVar3;
  Data *pDVar4;
  undefined4 *puVar5;
  QObject *pQVar6;
  long in_FS_OFFSET;
  Connection local_60;
  code *local_58;
  ImplFn local_50;
  code *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QLabelPrivate **)&(this->super_QFrame).super_QWidget.field_0x8;
  pDVar4 = (this_00->buddy).wp.d;
  if (((pDVar4 != (Data *)0x0) && (*(int *)(pDVar4 + 4) != 0)) &&
     (pQVar6 = (this_00->buddy).wp.value, pQVar6 != (QObject *)0x0)) {
    if (*(int *)(pDVar4 + 4) == 0) {
      pQVar6 = (QObject *)0x0;
    }
    local_48 = QObject::destroyed;
    local_40 = 0;
    local_58 = QLabelPrivate::buddyDeleted;
    local_50 = (ImplFn)0x0;
    QObject::disconnectImpl
              (pQVar6,&local_48,
               *(QObject **)&(this_00->super_QFramePrivate).super_QWidgetPrivate.field_0x8,&local_58
               ,(QMetaObject *)&QObject::staticMetaObject);
  }
  if (buddy == (QWidget *)0x0) {
    pDVar4 = (Data *)0x0;
  }
  else {
    pDVar4 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(&buddy->super_QObject);
  }
  pDVar1 = (this_00->buddy).wp.d;
  (this_00->buddy).wp.d = pDVar4;
  (this_00->buddy).wp.value = &buddy->super_QObject;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar1 = *(int *)pDVar1 + -1;
    UNLOCK();
    if (*(int *)pDVar1 == 0) {
      operator_delete(pDVar1);
    }
  }
  if (buddy != (QWidget *)0x0) {
    local_48 = QObject::destroyed;
    local_40 = 0;
    local_58 = QLabelPrivate::buddyDeleted;
    local_50 = (ImplFn)0x0;
    ppvVar2 = *(void ***)&(this_00->super_QFramePrivate).super_QWidgetPrivate.field_0x8;
    puVar5 = (undefined4 *)operator_new(0x20);
    *puVar5 = 1;
    *(code **)(puVar5 + 2) =
         QtPrivate::QPrivateSlotObject<void_(QLabelPrivate::*)(),_QtPrivate::List<>,_void>::impl;
    *(code **)(puVar5 + 4) = QLabelPrivate::buddyDeleted;
    *(undefined8 *)(puVar5 + 6) = 0;
    QObject::connectImpl
              ((QObject *)&local_60,(void **)buddy,(QObject *)&local_48,ppvVar2,
               (QSlotObjectBase *)&local_58,(ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection(&local_60);
  }
  uVar3 = *(ushort *)&this_00->field_0x340;
  if ((uVar3 & 0x10) != 0) {
    if (this_00->shortcutId != 0) {
      QWidget::releaseShortcut((QWidget *)this,this_00->shortcutId);
      uVar3 = *(ushort *)&this_00->field_0x340;
    }
    this_00->shortcutId = 0;
    *(ushort *)&this_00->field_0x340 = uVar3 | 8;
    if (buddy != (QWidget *)0x0) {
      QLabelPrivate::updateShortcut(this_00);
    }
    QLabelPrivate::updateLabel(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLabel::setBuddy(QWidget *buddy)
{
    Q_D(QLabel);

    if (d->buddy)
        QObjectPrivate::disconnect(d->buddy, &QObject::destroyed,
                                   d, &QLabelPrivate::buddyDeleted);

    d->buddy = buddy;

    if (buddy)
        QObjectPrivate::connect(buddy, &QObject::destroyed,
                                d, &QLabelPrivate::buddyDeleted);

    if (d->isTextLabel) {
        if (d->shortcutId)
            releaseShortcut(d->shortcutId);
        d->shortcutId = 0;
        d->textDirty = true;
        if (buddy)
            d->updateShortcut(); // grab new shortcut
        d->updateLabel();
    }
}